

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

void OpenSimpleHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  ostream *poVar1;
  AnonSimpleFile *this;
  mapped_type *ppAVar2;
  key_type local_78;
  CMConnection conn_local;
  string local_68;
  _OpenSimpleResponseMsg open_response_msg;
  
  conn_local = conn;
  poVar1 = std::operator<<((ostream *)&std::cout,"Got an open simple request for file ");
  poVar1 = std::operator<<(poVar1,*(char **)((long)vevent + 8));
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (AnonSimpleFile *)operator_new(0x50);
  std::__cxx11::string::string
            ((string *)&local_68,*(char **)((long)vevent + 8),(allocator *)&local_78);
  AnonSimpleFile::AnonSimpleFile(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::assign((char *)&this->m_FileName);
  open_response_msg.FileContents = (char *)0x0;
  open_response_msg.FileHandle = this->m_ID;
  open_response_msg.FileSize = this->m_Size;
  open_response_msg._4_4_ = 0;
  open_response_msg.OpenResponseCondition = *vevent;
  CMwrite(conn,*(undefined8 *)((long)client_data + 0x20));
  CMconn_register_close_handler(conn,ConnCloseHandler,0);
  local_78 = this->m_ID;
  ppAVar2 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&SimpleFileMap,&local_78);
  *ppAVar2 = this;
  std::
  _Hashtable<void*,std::pair<void*const,unsigned_long>,std::allocator<std::pair<void*const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_M_emplace<_CMConnection*&,long&>
            ((_Hashtable<void*,std::pair<void*const,unsigned_long>,std::allocator<std::pair<void*const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&ConnToFileMap,&conn_local,this);
  SimpleFilesOpened = SimpleFilesOpened + 1;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  return;
}

Assistant:

static void OpenSimpleHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                              attr_list attrs)
{
    OpenSimpleFileMsg open_msg = static_cast<OpenSimpleFileMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _OpenSimpleResponseMsg open_response_msg;
    std::cout << "Got an open simple request for file " << open_msg->FileName << std::endl;
    AnonSimpleFile *f = new AnonSimpleFile(open_msg->FileName);
    f->m_FileName = open_msg->FileName;
    memset(&open_response_msg, 0, sizeof(open_response_msg));
    open_response_msg.FileHandle = f->m_ID;
    open_response_msg.FileSize = f->m_Size;
    open_response_msg.OpenResponseCondition = open_msg->OpenResponseCondition;

    CMwrite(conn, ev_state->OpenSimpleResponseFormat, &open_response_msg);
    CMconn_register_close_handler(conn, ConnCloseHandler, NULL);
    SimpleFileMap[f->m_ID] = f;
    ConnToFileMap.emplace(conn, f->m_ID);
    SimpleFilesOpened++;
    last_service_time = std::chrono::steady_clock::now();
}